

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestDistribution<Blob<224>>
               (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,bool drawDiagram)

{
  double dVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  byte in_SIL;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_RDI;
  vector<int,_std::allocator<int>_> *pvVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  double pct;
  int i;
  double n;
  uint32_t index;
  Blob<224> *hash;
  size_t j;
  int bincount;
  int width;
  int start;
  int worstWidth;
  int worstStart;
  double worst;
  vector<int,_std::allocator<int>_> bins;
  int maxwidth;
  int hashbits;
  value_type in_stack_ffffffffffffff2c;
  reference in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *pvVar8;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_8c;
  size_type local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> local_38;
  uint local_1c;
  undefined4 local_18;
  byte local_11;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *local_10;
  byte local_1;
  
  local_11 = in_SIL & 1;
  local_10 = in_RDI;
  printf("Testing distribution - ");
  if ((local_11 & 1) != 0) {
    printf("\n");
  }
  local_18 = 0xe0;
  local_1c = 0x14;
  while( true ) {
    auVar7 = in_ZMM0._0_16_;
    sVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(local_10);
    auVar7 = vcvtusi2sd_avx512f(auVar7,sVar3);
    in_ZMM0 = ZEXT1664(ZEXT816(0x4014000000000000));
    if (5.0 <= auVar7._0_8_ / (double)(1 << ((byte)local_1c & 0x1f))) break;
    local_1c = local_1c - 1;
  }
  pvVar8 = &local_38;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18d3a3);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff50,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
            );
  local_50 = (vector<int,_std::allocator<int>_> *)0x0;
  local_54 = 0xffffffff;
  local_58 = 0xffffffff;
  local_5c = 0;
  do {
    if (0xdf < (int)local_5c) {
      dVar1 = (double)local_50 * 100.0;
      printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",dVar1,(ulong)local_58,
             (ulong)local_54);
      if (dVar1 < 1.0) {
        printf("\n");
      }
      else {
        printf(" !!!!!\n");
      }
      local_1 = dVar1 < 1.0;
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff40);
      return (bool)(local_1 & 1);
    }
    local_60 = local_1c;
    local_64 = 1 << ((byte)local_1c & 0x1f);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
    memset(pvVar4,0,(long)local_64 << 2);
    local_70 = 0;
    while (sVar3 = local_70,
          sVar5 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(local_10), sVar3 < sVar5
          ) {
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](local_10,local_70);
      uVar2 = window((void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(ulong)uVar2);
      *pvVar4 = *pvVar4 + 1;
      local_70 = local_70 + 1;
    }
    if ((local_11 & 1) != 0) {
      printf("[");
    }
    while (0xff < local_64) {
      in_stack_ffffffffffffff30 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
      in_stack_ffffffffffffff3c = local_64;
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(local_10);
      pvVar6 = (vector<int,_std::allocator<int>_> *)
               calcScore((int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int)((ulong)pvVar8 >> 0x20),(int)pvVar8);
      in_stack_ffffffffffffff40 = pvVar6;
      if ((local_11 & 1) != 0) {
        plot((double)in_stack_ffffffffffffff30);
      }
      if ((double)local_50 < (double)pvVar6) {
        local_54 = local_5c;
        local_58 = local_60;
        local_50 = pvVar6;
      }
      local_60 = local_60 - 1;
      local_64 = local_64 / 2;
      if ((int)local_60 < 8) break;
      for (local_8c = 0; local_8c < local_64; local_8c = local_8c + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_38,(long)(local_8c + local_64));
        in_stack_ffffffffffffff2c = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_8c);
        *pvVar4 = in_stack_ffffffffffffff2c + *pvVar4;
      }
    }
    if ((local_11 & 1) != 0) {
      printf("]\n");
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool TestDistribution ( std::vector<hashtype> & hashes, bool drawDiagram )
{
  printf("Testing distribution - ");

  if(drawDiagram) printf("\n");

  const int hashbits = sizeof(hashtype) * 8;

  int maxwidth = 20;

  // We need at least 5 keys per bin to reliably test distribution biases
  // down to 1%, so don't bother to test sparser distributions than that

  while(double(hashes.size()) / double(1 << maxwidth) < 5.0)
  {
    maxwidth--;
  }

  std::vector<int> bins;
  bins.resize(1 << maxwidth);

  double worst = 0;
  int worstStart = -1;
  int worstWidth = -1;

  for(int start = 0; start < hashbits; start++)
  {
    int width = maxwidth;
    int bincount = (1 << width);

    memset(&bins[0],0,sizeof(int)*bincount);

    for(size_t j = 0; j < hashes.size(); j++)
    {
      hashtype & hash = hashes[j];

      uint32_t index = window(&hash,sizeof(hash),start,width);

      bins[index]++;
    }

    // Test the distribution, then fold the bins in half,
    // repeat until we're down to 256 bins

    if(drawDiagram) printf("[");

    while(bincount >= 256)
    {
      double n = calcScore(&bins[0],bincount,(int)hashes.size());

      if(drawDiagram) plot(n);

      if(n > worst)
      {
        worst = n;
        worstStart = start;
        worstWidth = width;
      }

      width--;
      bincount /= 2;

      if(width < 8) break;

      for(int i = 0; i < bincount; i++)
      {
        bins[i] += bins[i+bincount];
      }
    }

    if(drawDiagram) printf("]\n");
  }

  double pct = worst * 100.0;

  printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",
         worstWidth, worstStart, pct);
  if(pct >= 1.0) {
    printf(" !!!!!\n");
    return false;
  }
  else {
    printf("\n");
    return true;
  }
}